

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O3

void __thiscall
test_vector_operators_tangent_projection_Test::~test_vector_operators_tangent_projection_Test
          (test_vector_operators_tangent_projection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, tangent_projection) {
  Vector_Dense<Scalar, 0> dynamic_vector = {4.0, -2.0, 3.0};
  Vector_Dense<Scalar, 0> dynamic_unit = {1.0, 0.0, 0.0};
  Vector_Dense<Scalar, 3> static_vector = {-1.0, -2.0, -3.0};
  Vector_Dense<Scalar, 3> static_unit = {0.0, 1.0 / std::sqrt(2.0), 1.0 / std::sqrt(2.0)};

  Vector_Dense<Scalar, 0> dynamic_result = projection_tangent(dynamic_vector, dynamic_unit);
  Vector_Dense<Scalar, 3> static_result = projection_tangent(static_vector, static_unit);
  EXPECT_DOUBLE_EQ(dynamic_result[0], 4.0);
  EXPECT_DOUBLE_EQ(dynamic_result[1], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_result[2], 0.0);
  EXPECT_DOUBLE_EQ(static_result[0], 0.0);
  EXPECT_DOUBLE_EQ(static_result[1], -2.5);
  EXPECT_DOUBLE_EQ(static_result[2], -2.5);

  Vector_Dense<Scalar, 0> dynamics_bad_size = {1.0, 2.0};
  Vector_Dense<Scalar, 2> static_bad_size = {1.0, 2.0};
  EXPECT_DEATH(projection_tangent(dynamic_vector, dynamics_bad_size), "./*");
  EXPECT_DEATH(projection_tangent(static_vector, static_bad_size), "./*");
}